

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_context.cpp
# Opt level: O0

void __thiscall jessilib::impl::timer_context::cancel(timer_context *this)

{
  bool bVar1;
  timer_manager *ptVar2;
  __shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  const_iterator local_58;
  lock_guard<std::mutex> local_50;
  lock_guard<std::mutex> detached_timers_lock;
  lock_guard<std::shared_mutex> local_30;
  lock_guard<std::shared_mutex> context_guard;
  lock_guard<std::mutex> manager_guard;
  bool needs_shared_lock;
  timer_manager *manager;
  timer_context *this_local;
  
  ptVar2 = timer_manager::instance();
  this_00 = (__shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2> *)
            timer_manager::thread_callback_timer();
  peVar3 = std::__shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>::get
                     (this_00);
  if (peVar3 == this) {
    std::shared_mutex::unlock_shared(&this->m_mutex);
  }
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&context_guard,&ptVar2->m_mutex)
  ;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_30,&this->m_mutex);
  bVar1 = null(this);
  if (!bVar1) {
    detached_timers_lock._M_device = (mutex_type *)this;
    std::
    multiset<jessilib::impl::timer_context_*,_jessilib::impl::timer_manager::timer_sort,_std::allocator<jessilib::impl::timer_context_*>_>
    ::erase(&ptVar2->m_active_timers,(key_type *)&detached_timers_lock);
    std::function<void_(jessilib::timer_&)>::operator=(&this->m_callback,(nullptr_t)0x0);
    bVar1 = detached(this);
    if (bVar1) {
      std::lock_guard<std::mutex>::lock_guard(&local_50,&ptVar2->m_detached_timers_mutex);
      std::_List_const_iterator<std::shared_ptr<jessilib::impl::timer_context>_>::
      _List_const_iterator(&local_58,&this->m_self);
      std::__cxx11::
      list<std::shared_ptr<jessilib::impl::timer_context>,_std::allocator<std::shared_ptr<jessilib::impl::timer_context>_>_>
      ::erase(&ptVar2->m_detached_timers,local_58);
      std::lock_guard<std::mutex>::~lock_guard(&local_50);
    }
  }
  ptVar2->is_timeout = false;
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_30);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&context_guard);
  if (peVar3 == this) {
    std::shared_mutex::lock_shared(&this->m_mutex);
  }
  std::condition_variable::notify_one();
  return;
}

Assistant:

void timer_context::cancel() {
	impl::timer_manager& manager = impl::timer_manager::instance();

	// Unlock mutex if it's currently being held by this thread
	bool needs_shared_lock = false;
	if (manager.thread_callback_timer().m_context.get() == this) {
		needs_shared_lock = true;
		m_mutex.unlock_shared();
	}

	{
		std::lock_guard<std::mutex> manager_guard(manager.m_mutex);
		std::lock_guard<std::shared_mutex> context_guard(m_mutex);

		if (!null()) {
			// Remove from active timers
			manager.m_active_timers.erase(this);

			// Nullify timer
			m_callback = nullptr;

			// Remove from detached timers (if it's detached)
			if (detached()) {
				std::lock_guard<std::mutex> detached_timers_lock(manager.m_detached_timers_mutex);
				manager.m_detached_timers.erase(m_self);
			}
		}

		manager.is_timeout = false;
	}

	// Re-lock mutex
	if (needs_shared_lock) {
		m_mutex.lock_shared();
	}

	manager.m_cvar.notify_one();
}